

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O3

bool __thiscall
google::protobuf::compiler::Parser::Parse(Parser *this,Tokenizer *input,FileDescriptorProto *file)

{
  string *psVar1;
  ErrorCollector *pEVar2;
  bool bVar3;
  int iVar4;
  LogMessage *pLVar5;
  SourceCodeInfo *this_00;
  byte bVar6;
  LocationRecorder root_location;
  SourceCodeInfo source_code_info;
  LogFinisher local_a9;
  LocationRecorder local_a8;
  LogMessage local_98;
  SourceCodeInfo local_60;
  
  this->input_ = input;
  this->had_errors_ = false;
  (this->syntax_identifier_)._M_string_length = 0;
  *(this->syntax_identifier_)._M_dataplus._M_p = '\0';
  SourceCodeInfo::SourceCodeInfo(&local_60);
  this->source_code_info_ = &local_60;
  if ((this->input_->current_).type == TYPE_START) {
    io::Tokenizer::NextWithComments
              (this->input_,(string *)0x0,&this->upcoming_detached_comments_,
               &this->upcoming_doc_comments_);
  }
  LocationRecorder::LocationRecorder(&local_a8,this);
  if (this->require_syntax_identifier_ == false) {
    iVar4 = std::__cxx11::string::compare((char *)&(this->input_->current_).text);
    if (iVar4 == 0) goto LAB_002cbc77;
    if (this->stop_after_syntax_identifier_ == false) {
      internal::LogMessage::LogMessage
                (&local_98,LOGLEVEL_WARNING,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/compiler/parser.cc"
                 ,0x222);
      pLVar5 = internal::LogMessage::operator<<
                         (&local_98,"No syntax specified for the proto file: ");
      pLVar5 = internal::LogMessage::operator<<(pLVar5,(file->name_).ptr_);
      pLVar5 = internal::LogMessage::operator<<(pLVar5,". Please use \'syntax = \"proto2\";\' ");
      pLVar5 = internal::LogMessage::operator<<
                         (pLVar5,"or \'syntax = \"proto3\";\' to specify a syntax ");
      pLVar5 = internal::LogMessage::operator<<(pLVar5,"version. (Defaulted to proto2 syntax.)");
      internal::LogFinisher::operator=(&local_a9,pLVar5);
      internal::LogMessage::~LogMessage(&local_98);
      std::__cxx11::string::_M_replace
                ((ulong)&this->syntax_identifier_,0,
                 (char *)(this->syntax_identifier_)._M_string_length,0x35d495);
    }
LAB_002cbcbf:
    if (this->stop_after_syntax_identifier_ == false) {
      if ((this->input_->current_).type != TYPE_END) {
        do {
          bVar3 = ParseTopLevelStatement(this,file,&local_a8);
          if (!bVar3) {
            SkipStatement(this);
            iVar4 = std::__cxx11::string::compare((char *)&(this->input_->current_).text);
            if (iVar4 == 0) {
              local_98._0_8_ = (long)&local_98 + 0x10;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_98,"Unmatched \"}\".","");
              pEVar2 = this->error_collector_;
              if (pEVar2 != (ErrorCollector *)0x0) {
                (*pEVar2->_vptr_ErrorCollector[2])
                          (pEVar2,(ulong)(uint)(this->input_->current_).line,
                           (ulong)(uint)(this->input_->current_).column,&local_98);
              }
              this->had_errors_ = true;
              if (local_98._0_8_ != (long)&local_98 + 0x10U) {
                operator_delete((void *)local_98._0_8_,local_98._16_8_ + 1);
              }
              io::Tokenizer::NextWithComments
                        (this->input_,(string *)0x0,&this->upcoming_detached_comments_,
                         &this->upcoming_doc_comments_);
            }
          }
        } while ((this->input_->current_).type != TYPE_END);
      }
      LocationRecorder::~LocationRecorder(&local_a8);
      this->input_ = (Tokenizer *)0x0;
      this->source_code_info_ = (SourceCodeInfo *)0x0;
      if (file == (FileDescriptorProto *)0x0) {
        __assert_fail("file != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/compiler/parser.cc"
                      ,0x23d,
                      "bool google::protobuf::compiler::Parser::Parse(io::Tokenizer *, FileDescriptorProto *)"
                     );
      }
      *(byte *)(file->_has_bits_).has_bits_ = (byte)(file->_has_bits_).has_bits_[0] | 0x10;
      this_00 = file->source_code_info_;
      if (this_00 == (SourceCodeInfo *)0x0) {
        this_00 = (SourceCodeInfo *)operator_new(0x30);
        SourceCodeInfo::SourceCodeInfo(this_00);
        file->source_code_info_ = this_00;
      }
      SourceCodeInfo::Swap(&local_60,this_00);
      bVar6 = this->had_errors_ ^ 1;
      goto LAB_002cbdfe;
    }
    bVar6 = this->had_errors_ ^ 1;
  }
  else {
LAB_002cbc77:
    bVar3 = ParseSyntaxIdentifier(this,&local_a8);
    if (bVar3) {
      if (file != (FileDescriptorProto *)0x0) {
        *(byte *)(file->_has_bits_).has_bits_ = (byte)(file->_has_bits_).has_bits_[0] | 4;
        psVar1 = (file->syntax_).ptr_;
        if (psVar1 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
          internal::ArenaStringPtr::CreateInstanceNoArena(&file->syntax_,&this->syntax_identifier_);
        }
        else {
          std::__cxx11::string::_M_assign((string *)psVar1);
        }
      }
      goto LAB_002cbcbf;
    }
    bVar6 = 0;
  }
  LocationRecorder::~LocationRecorder(&local_a8);
LAB_002cbdfe:
  SourceCodeInfo::~SourceCodeInfo(&local_60);
  return (bool)bVar6;
}

Assistant:

bool Parser::Parse(io::Tokenizer* input, FileDescriptorProto* file) {
  input_ = input;
  had_errors_ = false;
  syntax_identifier_.clear();

  // Note that |file| could be NULL at this point if
  // stop_after_syntax_identifier_ is true.  So, we conservatively allocate
  // SourceCodeInfo on the stack, then swap it into the FileDescriptorProto
  // later on.
  SourceCodeInfo source_code_info;
  source_code_info_ = &source_code_info;

  if (LookingAtType(io::Tokenizer::TYPE_START)) {
    // Advance to first token.
    input_->NextWithComments(NULL, &upcoming_detached_comments_,
                             &upcoming_doc_comments_);
  }

  {
    LocationRecorder root_location(this);

    if (require_syntax_identifier_ || LookingAt("syntax")) {
      if (!ParseSyntaxIdentifier(root_location)) {
        // Don't attempt to parse the file if we didn't recognize the syntax
        // identifier.
        return false;
      }
      // Store the syntax into the file.
      if (file != NULL) file->set_syntax(syntax_identifier_);
    } else if (!stop_after_syntax_identifier_) {
      GOOGLE_LOG(WARNING) << "No syntax specified for the proto file: "
                   << file->name() << ". Please use 'syntax = \"proto2\";' "
                   << "or 'syntax = \"proto3\";' to specify a syntax "
                   << "version. (Defaulted to proto2 syntax.)";
      syntax_identifier_ = "proto2";
    }

    if (stop_after_syntax_identifier_) return !had_errors_;

    // Repeatedly parse statements until we reach the end of the file.
    while (!AtEnd()) {
      if (!ParseTopLevelStatement(file, root_location)) {
        // This statement failed to parse.  Skip it, but keep looping to parse
        // other statements.
        SkipStatement();

        if (LookingAt("}")) {
          AddError("Unmatched \"}\".");
          input_->NextWithComments(NULL, &upcoming_detached_comments_,
                                   &upcoming_doc_comments_);
        }
      }
    }
  }

  input_ = NULL;
  source_code_info_ = NULL;
  assert(file != NULL);
  source_code_info.Swap(file->mutable_source_code_info());
  return !had_errors_;
}